

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O3

int maxdirsterid<cbtVector3>
              (cbtVector3 *p,int count,cbtVector3 *dir,cbtAlignedObjectArray<int> *allow)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar16 [64];
  float fVar18;
  undefined1 in_ZMM1 [64];
  undefined1 auVar19 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  cbtVector3 cVar23;
  cbtVector3 local_78;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  undefined1 auVar17 [56];
  undefined1 auVar20 [56];
  
  do {
    auVar20 = in_ZMM1._8_56_;
    auVar17 = in_ZMM0._8_56_;
    iVar4 = maxdirfiltered<cbtVector3>(p,count,dir,allow);
    if (allow->m_data[iVar4] == 3) {
      return iVar4;
    }
    cVar23 = orth(dir);
    auVar19._0_8_ = cVar23.m_floats._8_8_;
    auVar19._8_56_ = auVar20;
    auVar16._0_8_ = cVar23.m_floats._0_8_;
    auVar16._8_56_ = auVar17;
    local_58 = auVar19._0_16_;
    uVar1 = *(ulong *)(dir->m_floats + 1);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar1;
    _local_48 = auVar16._0_16_;
    auVar9 = vmovshdup_avx(_local_48);
    auVar2 = vinsertps_avx(local_58,_local_48,0x1c);
    auVar22._0_4_ = (float)uVar1 * auVar2._0_4_;
    auVar22._4_4_ = (float)(uVar1 >> 0x20) * auVar2._4_4_;
    auVar22._8_4_ = auVar2._8_4_ * 0.0;
    auVar22._12_4_ = auVar2._12_4_ * 0.0;
    auVar8 = vpermt2ps_avx512vl(local_58,_DAT_009e2040,_local_48);
    auVar2 = vfmsub231ss_fma(ZEXT416((uint)(dir->m_floats[0] * auVar9._0_4_)),_local_48,auVar21);
    auVar9 = vpermt2ps_avx512vl(auVar21,_DAT_009d86b0,ZEXT416((uint)dir->m_floats[0]));
    in_ZMM1 = ZEXT864(0);
    _local_68 = vfmsub213ps_fma(auVar9,auVar8,auVar22);
    iVar7 = -1;
    do {
      fVar18 = in_ZMM1._0_4_;
      fVar10 = sinf(fVar18 * 0.017453292);
      fVar11 = cosf(fVar18 * 0.017453292);
      auVar8._0_4_ = fVar10 * (float)local_48._0_4_ + fVar11 * (float)local_68._0_4_;
      auVar8._4_4_ = fVar10 * (float)local_48._4_4_ + fVar11 * (float)local_68._4_4_;
      auVar8._8_4_ = fVar10 * fStack_40 + fVar11 * fStack_60;
      auVar8._12_4_ = fVar10 * fStack_3c + fVar11 * fStack_5c;
      auVar9._8_4_ = 0x3ccccccd;
      auVar9._0_8_ = 0x3ccccccd3ccccccd;
      auVar9._12_4_ = 0x3ccccccd;
      auVar9 = vmulps_avx512vl(auVar8,auVar9);
      auVar13._0_4_ = (float)*(undefined8 *)dir->m_floats + auVar9._0_4_;
      auVar13._4_4_ = (float)((ulong)*(undefined8 *)dir->m_floats >> 0x20) + auVar9._4_4_;
      auVar13._8_4_ = auVar9._8_4_ + 0.0;
      auVar13._12_4_ = auVar9._12_4_ + 0.0;
      local_78.m_floats =
           (cbtScalar  [4])
           vinsertps_avx(auVar13,ZEXT416((uint)((fVar10 * (float)local_58._0_4_ +
                                                fVar11 * auVar2._0_4_) * 0.025 + dir->m_floats[2])),
                         0x28);
      iVar5 = maxdirfiltered<cbtVector3>(p,count,&local_78,allow);
      if (iVar5 == iVar4 && iVar7 == iVar4) {
LAB_008edb45:
        allow->m_data[iVar4] = 3;
        return iVar4;
      }
      fVar10 = fVar18 + -40.0;
      if ((iVar7 != -1) && (iVar7 != iVar5)) {
        for (; fVar10 <= fVar18; fVar10 = fVar10 + 5.0) {
          fVar11 = sinf(fVar10 * 0.017453292);
          fVar12 = cosf(fVar10 * 0.017453292);
          auVar14._0_4_ = fVar11 * (float)local_48._0_4_ + fVar12 * (float)local_68._0_4_;
          auVar14._4_4_ = fVar11 * (float)local_48._4_4_ + fVar12 * (float)local_68._4_4_;
          auVar14._8_4_ = fVar11 * fStack_40 + fVar12 * fStack_60;
          auVar14._12_4_ = fVar11 * fStack_3c + fVar12 * fStack_5c;
          auVar3._8_4_ = 0x3ccccccd;
          auVar3._0_8_ = 0x3ccccccd3ccccccd;
          auVar3._12_4_ = 0x3ccccccd;
          auVar9 = vmulps_avx512vl(auVar14,auVar3);
          auVar15._0_4_ = (float)*(undefined8 *)dir->m_floats + auVar9._0_4_;
          auVar15._4_4_ = (float)((ulong)*(undefined8 *)dir->m_floats >> 0x20) + auVar9._4_4_;
          auVar15._8_4_ = auVar9._8_4_ + 0.0;
          auVar15._12_4_ = auVar9._12_4_ + 0.0;
          local_78.m_floats =
               (cbtScalar  [4])
               vinsertps_avx(auVar15,ZEXT416((uint)((fVar11 * (float)local_58._0_4_ +
                                                    fVar12 * auVar2._0_4_) * 0.025 +
                                                   dir->m_floats[2])),0x28);
          iVar6 = maxdirfiltered<cbtVector3>(p,count,&local_78,allow);
          if (iVar6 == iVar4 && iVar7 == iVar4) goto LAB_008edb45;
          iVar7 = iVar6;
        }
      }
      in_ZMM1 = ZEXT464((uint)(fVar18 + 45.0));
      in_ZMM0 = ZEXT464(0x43b40000);
      iVar7 = iVar5;
    } while (fVar18 + 45.0 <= 360.0);
    allow->m_data[iVar4] = 0;
  } while( true );
}

Assistant:

int maxdirsterid(const T *p, int count, const T &dir, cbtAlignedObjectArray<int> &allow)
{
	int m = -1;
	while (m == -1)
	{
		m = maxdirfiltered(p, count, dir, allow);
		if (allow[m] == 3) return m;
		T u = orth(dir);
		T v = cbtCross(u, dir);
		int ma = -1;
		for (cbtScalar x = cbtScalar(0.0); x <= cbtScalar(360.0); x += cbtScalar(45.0))
		{
			cbtScalar s = cbtSin(SIMD_RADS_PER_DEG * (x));
			cbtScalar c = cbtCos(SIMD_RADS_PER_DEG * (x));
			int mb = maxdirfiltered(p, count, dir + (u * s + v * c) * cbtScalar(0.025), allow);
			if (ma == m && mb == m)
			{
				allow[m] = 3;
				return m;
			}
			if (ma != -1 && ma != mb)  // Yuck - this is really ugly
			{
				int mc = ma;
				for (cbtScalar xx = x - cbtScalar(40.0); xx <= x; xx += cbtScalar(5.0))
				{
					cbtScalar s = cbtSin(SIMD_RADS_PER_DEG * (xx));
					cbtScalar c = cbtCos(SIMD_RADS_PER_DEG * (xx));
					int md = maxdirfiltered(p, count, dir + (u * s + v * c) * cbtScalar(0.025), allow);
					if (mc == m && md == m)
					{
						allow[m] = 3;
						return m;
					}
					mc = md;
				}
			}
			ma = mb;
		}
		allow[m] = 0;
		m = -1;
	}
	cbtAssert(0);
	return m;
}